

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitForStatement(SyntaxDumper *this,ForStatementSyntax *node)

{
  ForStatementSyntax local_50 [56];
  
  ForStatementSyntax::forKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  ForStatementSyntax::openParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  ForStatementSyntax::extensionKeyword(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x30));
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x38));
  ForStatementSyntax::semicolonToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x48));
  ForStatementSyntax::closeParenthesisToken(local_50);
  (**(code **)(*(long *)this + 0x2e8))(this,local_50,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)local_50);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x58));
  return Skip;
}

Assistant:

virtual Action visitForStatement(const ForStatementSyntax* node) override
    {
        terminal(node->forKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        terminal(node->extensionKeyword(), node);
        nonterminal(node->initializer());
        nonterminal(node->condition());
        terminal(node->semicolonToken(), node);
        nonterminal(node->expression());
        terminal(node->closeParenthesisToken(), node);
        nonterminal(node->statement());
        return Action::Skip;
    }